

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O2

void poly_BinarySink_write(BinarySink *bs,void *blkv,size_t len)

{
  chacha20 *ctx;
  undefined1 uVar1;
  BinarySink *pBVar2;
  uint uVar3;
  size_t sVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  uchar *chunk;
  int iVar8;
  ulong uVar9;
  size_t __n;
  ulong local_48;
  ulong uStack_40;
  
  iVar8 = *(int *)&bs[-5].binarysink_;
  uVar3 = 7 - iVar8;
  sVar7 = len;
  for (sVar4 = 0; (iVar5 = (int)sVar4, iVar8 + iVar5 < 4 && (len != sVar4)); sVar4 = sVar4 + 1) {
    *(undefined1 *)((long)bs + ((ulong)uVar3 - 100)) = *(undefined1 *)((long)blkv + sVar4);
    *(int *)&bs[-5].binarysink_ = iVar8 + iVar5 + 1;
    sVar7 = sVar7 - 1;
    uVar3 = uVar3 - 1;
  }
  if (iVar8 + iVar5 == 4) {
    ctx = (chacha20 *)((long)&bs[-10].write + 4);
    chacha20_iv(ctx,(uchar *)((long)&bs[-5].binarysink_ + 4));
    *(int *)&bs[-5].binarysink_ = *(int *)&bs[-5].binarysink_ + 1;
    chacha20_round(ctx);
    local_48 = *(ulong *)((long)&bs[-8].binarysink_ + 4) & 0xffffffc0fffffff;
    uStack_40 = *(ulong *)((long)&bs[-7].write + 4) & 0xffffffc0ffffffc;
    bigval_import_le((bigval *)(bs + -3),&local_48,0x10);
    smemclr(&local_48,0x10);
    pBVar2 = *(BinarySink **)((long)&bs[-7].binarysink_ + 4);
    bs[-4].writefmtv =
         *(_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr **)((long)&bs[-7].writefmtv + 4);
    bs[-4].binarysink_ = pBVar2;
    *(undefined4 *)((long)&bs[-5].writefmtv + 4) = 0x40;
  }
  uVar9 = len - sVar4;
  if (uVar9 != 0) {
    iVar8 = *(int *)&bs[-1].binarysink_;
    if (iVar8 == 0) {
      chunk = (uchar *)((long)blkv + sVar4);
    }
    else {
      for (lVar6 = 0; (iVar5 = (int)lVar6, iVar8 < 0x10 && ((int)uVar9 != iVar5)); lVar6 = lVar6 + 1
          ) {
        uVar1 = *(undefined1 *)((long)blkv + sVar4 + lVar6);
        *(int *)&bs[-1].binarysink_ = iVar8 + 1;
        *(undefined1 *)((long)&bs[-1].write + (long)iVar8) = uVar1;
        iVar8 = *(int *)&bs[-1].binarysink_;
      }
      chunk = (uchar *)((long)blkv + lVar6 + sVar4);
      if (iVar8 == 0x10) {
        poly1305_feed_chunk((poly1305 *)&bs[-4].writefmtv,(uchar *)(bs + -1),0x10);
        *(undefined4 *)&bs[-1].binarysink_ = 0;
        uVar9 = (ulong)(uint)((int)sVar7 - iVar5);
      }
      else {
        uVar9 = (ulong)(uint)((int)sVar7 - iVar5);
      }
    }
    for (__n = (size_t)(int)uVar9; iVar8 = (int)__n, 0xf < iVar8; __n = __n - 0x10) {
      poly1305_feed_chunk((poly1305 *)&bs[-4].writefmtv,chunk,0x10);
      chunk = chunk + 0x10;
    }
    if (iVar8 != 0) {
      memcpy(bs + -1,chunk,__n);
      *(int *)&bs[-1].binarysink_ = iVar8;
    }
  }
  return;
}

Assistant:

static void poly_BinarySink_write(BinarySink *bs, const void *blkv, size_t len)
{
    struct ccp_context *ctx = BinarySink_DOWNCAST(bs, struct ccp_context);
    const unsigned char *blk = (const unsigned char *)blkv;

    /* First 4 bytes are the IV */
    while (ctx->mac_initialised < 4 && len) {
        ctx->mac_iv[7 - ctx->mac_initialised] = *blk++;
        ++ctx->mac_initialised;
        --len;
    }

    /* Initialise the IV if needed */
    if (ctx->mac_initialised == 4) {
        chacha20_iv(&ctx->b_cipher, ctx->mac_iv);
        ++ctx->mac_initialised;  /* Don't do it again */

        /* Do first rotation */
        chacha20_round(&ctx->b_cipher);

        /* Set the poly key */
        poly1305_key(&ctx->mac, make_ptrlen(ctx->b_cipher.current, 32));

        /* Set the first round as used */
        ctx->b_cipher.currentIndex = 64;
    }

    /* Update the MAC with anything left */
    if (len) {
        poly1305_feed(&ctx->mac, blk, len);
    }
}